

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 make_dict_triphone_list
                (dicthashelement_t **dicthash,hashelement_t ***triphonehash,int ignore_wpos)

{
  phnhashelement_t *l;
  int iVar1;
  int iVar2;
  hashelement_t **hashtable;
  phnhashelement_t **hashtable_00;
  phnhashelement_t **hashtable_01;
  char *pcVar3;
  hashelement_t *phVar4;
  char *pcVar5;
  int local_a8;
  int local_a4;
  int32 k;
  int32 j;
  int32 i;
  int32 lnphns;
  int32 swdtphs;
  int32 iwdtphs;
  int32 ewdtphs;
  int32 bwdtphs;
  int32 totwds;
  int32 totaltphs;
  char *silencephn;
  char *wpos;
  char *rctx;
  char *lctx;
  char *bphn;
  phnhashelement_t **ephnhash;
  phnhashelement_t *ephnptr;
  phnhashelement_t **bphnhash;
  phnhashelement_t *bphnptr;
  dicthashelement_t *word_el;
  hashelement_t *tphnptr;
  hashelement_t **tphnhash;
  int ignore_wpos_local;
  hashelement_t ***triphonehash_local;
  dicthashelement_t **dicthash_local;
  
  hashtable = (hashelement_t **)
              __ckd_calloc__(0x5dc1,0x30,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                             ,0x159);
  hashtable_00 = (phnhashelement_t **)calloc(0x65,0x18);
  hashtable_01 = (phnhashelement_t **)calloc(0x65,0x18);
  if ((hashtable_00 == (phnhashelement_t **)0x0) || (hashtable_01 == (phnhashelement_t **)0x0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x15d,"Unable to alloc %d size phone hashtables!\n",0x65);
    exit(1);
  }
  phninstall("SIL",hashtable_00);
  phninstall("SIL",hashtable_01);
  for (k = 0; k < 0x2717; k = k + 1) {
    for (bphnptr = (phnhashelement_t *)dicthash[k]; bphnptr != (phnhashelement_t *)0x0;
        bphnptr = (phnhashelement_t *)bphnptr[1].phone) {
      if ((*(char *)**(undefined8 **)&bphnptr->count != '+') &&
         (iVar1 = strcmp((char *)**(undefined8 **)&bphnptr->count,"SIL"), iVar1 != 0)) {
        phninstall((char *)**(undefined8 **)&bphnptr->count,hashtable_00);
      }
      if ((**(char **)(*(long *)&bphnptr->count + (long)(*(int *)&bphnptr->next + -1) * 8) != '+')
         && (iVar1 = strcmp(*(char **)(*(long *)&bphnptr->count +
                                      (long)(*(int *)&bphnptr->next + -1) * 8),"SIL"), iVar1 != 0))
      {
        phninstall(*(char **)(*(long *)&bphnptr->count + (long)(*(int *)&bphnptr->next + -1) * 8),
                   hashtable_01);
      }
    }
  }
  i = 0;
  lnphns = 0;
  swdtphs = 0;
  iwdtphs = 0;
  ewdtphs = 0;
  k = 0;
  do {
    if (0x2716 < k) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1ba,"%d words in dictionary\n",(ulong)(uint)ewdtphs);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bb,"%d unique single word triphones in dictionary\n",(ulong)(uint)i);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bc,"%d unique word beginning triphones in dictionary\n",(ulong)(uint)iwdtphs);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1bd,"%d unique word internal triphones in dictionary\n",(ulong)(uint)lnphns);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
              ,0x1be,"%d unique word ending triphones in dictionary\n",(ulong)(uint)swdtphs);
      *triphonehash = hashtable;
      freephnhash(hashtable_00);
      freephnhash(hashtable_01);
      return 0;
    }
    bphnptr = (phnhashelement_t *)dicthash[k];
    while (bphnptr != (phnhashelement_t *)0x0) {
      ewdtphs = ewdtphs + 1;
      iVar1 = *(int *)&bphnptr->next;
      if (iVar1 == 1) {
        pcVar3 = wordpos2str(WORD_POSN_SINGLE,ignore_wpos);
        pcVar5 = (char *)**(undefined8 **)&bphnptr->count;
        if ((*pcVar5 == '+') || (iVar1 = strcmp(pcVar5,"SIL"), iVar1 == 0)) {
          bphnptr = (phnhashelement_t *)bphnptr[1].phone;
        }
        else {
          for (local_a4 = 0; local_a4 < 0x65; local_a4 = local_a4 + 1) {
            for (ephnhash = (phnhashelement_t **)hashtable_01[local_a4];
                ephnhash != (phnhashelement_t **)0x0; ephnhash = (phnhashelement_t **)ephnhash[2]) {
              l = *ephnhash;
              for (local_a8 = 0; local_a8 < 0x65; local_a8 = local_a8 + 1) {
                for (bphnhash = (phnhashelement_t **)hashtable_00[local_a8];
                    bphnhash != (phnhashelement_t **)0x0;
                    bphnhash = (phnhashelement_t **)bphnhash[2]) {
                  phVar4 = install(pcVar5,(char *)l,(char *)*bphnhash,pcVar3,hashtable);
                  if (phVar4->dictcount == 0) {
                    i = i + 1;
                  }
                  phVar4->dictcount = phVar4->dictcount + 1;
                }
              }
            }
          }
LAB_001051ed:
          bphnptr = (phnhashelement_t *)bphnptr[1].phone;
        }
      }
      else {
        pcVar3 = wordpos2str(WORD_POSN_BEGIN,ignore_wpos);
        pcVar5 = (char *)**(undefined8 **)&bphnptr->count;
        if ((*pcVar5 == '+') || (iVar2 = strcmp(pcVar5,"SIL"), iVar2 == 0)) {
          bphnptr = (phnhashelement_t *)bphnptr[1].phone;
        }
        else {
          wpos = *(char **)(*(long *)&bphnptr->count + 8);
          if ((*wpos == '+') || (iVar2 = strcmp(wpos,"SIL"), iVar2 == 0)) {
            wpos = "SIL";
          }
          for (local_a4 = 0; local_a4 < 0x65; local_a4 = local_a4 + 1) {
            for (ephnhash = (phnhashelement_t **)hashtable_01[local_a4];
                ephnhash != (phnhashelement_t **)0x0; ephnhash = (phnhashelement_t **)ephnhash[2]) {
              phVar4 = install(pcVar5,(char *)*ephnhash,wpos,pcVar3,hashtable);
              if (phVar4->dictcount == 0) {
                iwdtphs = iwdtphs + 1;
              }
              phVar4->dictcount = phVar4->dictcount + 1;
            }
          }
          pcVar5 = wordpos2str(WORD_POSN_INTERNAL,ignore_wpos);
          for (local_a4 = 1; local_a4 < iVar1 + -1; local_a4 = local_a4 + 1) {
            pcVar3 = *(char **)(*(long *)&bphnptr->count + (long)local_a4 * 8);
            if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
              rctx = *(char **)(*(long *)&bphnptr->count + (long)(local_a4 + -1) * 8);
              if ((*rctx == '+') || (iVar2 = strcmp(rctx,"SIL"), iVar2 == 0)) {
                rctx = "SIL";
              }
              wpos = *(char **)(*(long *)&bphnptr->count + (long)(local_a4 + 1) * 8);
              if ((*wpos == '+') || (iVar2 = strcmp(wpos,"SIL"), iVar2 == 0)) {
                wpos = "SIL";
              }
              phVar4 = install(pcVar3,rctx,wpos,pcVar5,hashtable);
              if (phVar4->dictcount == 0) {
                lnphns = lnphns + 1;
              }
              phVar4->dictcount = phVar4->dictcount + 1;
            }
          }
          pcVar3 = wordpos2str(WORD_POSN_END,ignore_wpos);
          pcVar5 = *(char **)(*(long *)&bphnptr->count + (long)(iVar1 + -1) * 8);
          if ((*pcVar5 != '+') && (iVar2 = strcmp(pcVar5,"SIL"), iVar2 != 0)) {
            rctx = *(char **)(*(long *)&bphnptr->count + (long)(iVar1 + -2) * 8);
            if ((*rctx == '+') || (iVar1 = strcmp(rctx,"SIL"), iVar1 == 0)) {
              rctx = "SIL";
            }
            for (local_a4 = 0; local_a4 < 0x65; local_a4 = local_a4 + 1) {
              for (bphnhash = (phnhashelement_t **)hashtable_00[local_a4];
                  bphnhash != (phnhashelement_t **)0x0; bphnhash = (phnhashelement_t **)bphnhash[2])
              {
                phVar4 = install(pcVar5,rctx,(char *)*bphnhash,pcVar3,hashtable);
                if (phVar4->dictcount == 0) {
                  swdtphs = swdtphs + 1;
                }
                phVar4->dictcount = phVar4->dictcount + 1;
              }
            }
            goto LAB_001051ed;
          }
          bphnptr = (phnhashelement_t *)bphnptr[1].phone;
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int32 make_dict_triphone_list (dicthashelement_t **dicthash,
			  hashelement_t ***triphonehash,
			  int ignore_wpos)
{
    hashelement_t **tphnhash, *tphnptr;
    dicthashelement_t *word_el;
    phnhashelement_t *bphnptr, **bphnhash, *ephnptr, **ephnhash;
    char *bphn, *lctx, *rctx;
    const char* wpos;
    char *silencephn = "SIL";
    int32 totaltphs, totwds, bwdtphs, ewdtphs, iwdtphs, swdtphs, lnphns;
    int32 i,j,k;

    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t));
    bphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    ephnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));
    if (bphnhash == NULL || ephnhash == NULL)
	E_FATAL("Unable to alloc %d size phone hashtables!\n",(int)PHNHASHSIZE);

    /*First count all phones that can begin or end a word (SIL can by default)*/
    phninstall(silencephn,bphnhash);
    phninstall(silencephn,ephnhash);
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    if (!IS_FILLER(word_el->phones[0]))
	        phninstall(word_el->phones[0],bphnhash);
	    if (!IS_FILLER(word_el->phones[word_el->nphns - 1]))
	        phninstall(word_el->phones[word_el->nphns - 1],ephnhash);
	    word_el = word_el->next;
        }
    }

    /* Scan dictionary and make triphone list */
    totwds = bwdtphs = ewdtphs = iwdtphs = swdtphs = 0;
    for (i = 0; i < DICTHASHSIZE; i++){
        word_el = dicthash[i];
        while (word_el != NULL){
	    totwds++;
            lnphns = word_el->nphns;
            if (lnphns == 1) {
                wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
		        for (k = 0; k < PHNHASHSIZE; k++){
		    	    bphnptr = bphnhash[k];
		    	    while (bphnptr != NULL){
				rctx = bphnptr->phone;
                                tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
				if (tphnptr->dictcount == 0) swdtphs++;
				tphnptr->dictcount++;
				bphnptr = bphnptr->next;
			    }
			}
			ephnptr = ephnptr->next;
		    }
		}
            }
            else {
                wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
                bphn = word_el->phones[0];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		rctx = word_el->phones[1];
		if (IS_FILLER(rctx)) rctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    ephnptr = ephnhash[j];
		    while (ephnptr != NULL){
			lctx = ephnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) bwdtphs++;
			tphnptr->dictcount++;
			ephnptr = ephnptr->next;
		    }
		}
                wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
                for (j=1;j<lnphns-1;j++){
                    bphn = word_el->phones[j];
		    if (IS_FILLER(bphn)) continue;
                    lctx = word_el->phones[j-1];
		    if (IS_FILLER(lctx)) lctx = silencephn;
                    rctx = word_el->phones[j+1];
		    if (IS_FILLER(rctx)) rctx = silencephn;
                    tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
		    if (tphnptr->dictcount == 0) iwdtphs++;
		    tphnptr->dictcount++;
                }
                wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
                bphn = word_el->phones[lnphns-1];
		if (IS_FILLER(bphn)) {word_el = word_el->next; continue;}
		lctx = word_el->phones[lnphns-2];
		if (IS_FILLER(lctx)) lctx = silencephn;
		for (j = 0; j < PHNHASHSIZE; j++){
		    bphnptr = bphnhash[j];
		    while (bphnptr != NULL){
			rctx = bphnptr->phone;
                        tphnptr = install(bphn,lctx,rctx,wpos,tphnhash);
			if (tphnptr->dictcount == 0) ewdtphs++;
			tphnptr->dictcount++;
			bphnptr = bphnptr->next;
		    }
		}
            }
	    word_el = word_el->next;
        }
    }
    totaltphs = swdtphs + bwdtphs + iwdtphs + ewdtphs;
    E_INFO("%d words in dictionary\n",totwds);
    E_INFO("%d unique single word triphones in dictionary\n",swdtphs);
    E_INFO("%d unique word beginning triphones in dictionary\n",bwdtphs);
    E_INFO("%d unique word internal triphones in dictionary\n",iwdtphs);
    E_INFO("%d unique word ending triphones in dictionary\n",ewdtphs);

    *triphonehash = tphnhash;

    freephnhash(bphnhash); freephnhash(ephnhash);

    return S3_SUCCESS;
}